

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

void __thiscall
sisl::sparse_array_n<float,_2,_std::allocator<float>_>::sparse_array_n
          (sparse_array_n<float,_2,_std::allocator<float>_> *this,float *dv,uint d0,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  uint *local_160;
  uint local_138 [6];
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined4 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
  local_88;
  int local_4c;
  uint local_48;
  int i;
  va_list vl;
  uint n;
  allocator<float> local_1d;
  uint local_1c;
  float *pfStack_18;
  uint d0_local;
  float *dv_local;
  sparse_array_n<float,_2,_std::allocator<float>_> *this_local;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Da;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  local_1c = d0;
  pfStack_18 = dv;
  dv_local = (float *)this;
  std::allocator<float>::allocator(&local_1d);
  array_n<float,_2,_std::allocator<float>_>::array_n
            (&this->super_array_n<float,_2,_std::allocator<float>_>,&local_1d);
  std::allocator<float>::~allocator(&local_1d);
  std::
  unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
  ::unordered_map(&this->siteMap);
  this->defaultValue = *pfStack_18;
  vl[0].reg_save_area._0_4_ = local_1c;
  vl[0].overflow_arg_area = local_138;
  vl[0]._0_8_ = &stack0x00000008;
  i = 0x30;
  local_48 = 0x18;
  this->_dims[0] = local_1c;
  for (local_4c = 1; local_4c < 2; local_4c = local_4c + 1) {
    if (local_48 < 0x29) {
      local_160 = (uint *)((long)vl[0].overflow_arg_area + (long)(int)local_48);
      local_48 = local_48 + 8;
    }
    else {
      local_160 = (uint *)vl[0]._0_8_;
      vl[0]._0_8_ = vl[0]._0_8_ + 8;
    }
    this->_dims[local_4c] = *local_160;
    vl[0].reg_save_area._0_4_ = this->_dims[local_4c] * (uint)vl[0].reg_save_area;
  }
  local_88._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_88._M_h._M_rehash_policy._4_4_ = 0;
  local_88._M_h._M_rehash_policy._M_next_resize = 0;
  local_88._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88._M_h._M_element_count = 0;
  local_88._M_h._M_buckets = (__buckets_ptr)0x0;
  local_88._M_h._M_bucket_count = 0;
  local_88._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
  ::unordered_map(&local_88);
  std::
  unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
  ::operator=(&this->siteMap,&local_88);
  std::
  unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
  ::~unordered_map(&local_88);
  return;
}

Assistant:

sparse_array_n(const T &dv, unsigned int d0, ...) : defaultValue(dv) {
            unsigned int n = d0;

            // Start with d0
            va_list vl;
            va_start(vl, d0);

            _dims[0] = d0;

            for(int i = 1; i < N; i++) {
                _dims[i] = va_arg(vl, unsigned int);
                n *= _dims[i];
            }
            va_end(vl);
            siteMap = std::unordered_map<int, T>();
        }